

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

char * cmXMLParser::FindAttribute(char **atts,char *attribute)

{
  int iVar1;
  bool bVar2;
  char **local_28;
  char **a;
  char *attribute_local;
  char **atts_local;
  
  if ((atts == (char **)0x0) || (local_28 = atts, attribute == (char *)0x0)) {
LAB_0050cba2:
    atts_local = (char **)0x0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (*local_28 != (char *)0x0) {
        bVar2 = local_28[1] != (char *)0x0;
      }
      if (!bVar2) goto LAB_0050cba2;
      iVar1 = strcmp(*local_28,attribute);
      if (iVar1 == 0) break;
      local_28 = local_28 + 2;
    }
    atts_local = (char **)local_28[1];
  }
  return (char *)atts_local;
}

Assistant:

const char* cmXMLParser::FindAttribute(const char** atts,
                                       const char* attribute)
{
  if (atts && attribute) {
    for (const char** a = atts; *a && *(a + 1); a += 2) {
      if (strcmp(*a, attribute) == 0) {
        return *(a + 1);
      }
    }
  }
  return nullptr;
}